

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int check_bounds(FullMvLimits *mv_limits,int row,int col,int range)

{
  int range_local;
  int col_local;
  int row_local;
  FullMvLimits *mv_limits_local;
  
  return (uint)(((mv_limits->row_min <= row - range && row + range <= mv_limits->row_max) &&
                mv_limits->col_min <= col - range) && col + range <= mv_limits->col_max);
}

Assistant:

static inline int check_bounds(const FullMvLimits *mv_limits, int row, int col,
                               int range) {
  return ((row - range) >= mv_limits->row_min) &
         ((row + range) <= mv_limits->row_max) &
         ((col - range) >= mv_limits->col_min) &
         ((col + range) <= mv_limits->col_max);
}